

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

u_char * ngx_sprintf_num(u_char *buf,u_char *last,uint64_t ui64,u_char zero,ngx_uint_t hexadecimal,
                        ngx_uint_t width)

{
  u_char *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  u_char *puVar5;
  uint uVar6;
  u_char *puVar7;
  bool bVar8;
  u_char temp [21];
  
  puVar1 = temp + 0xc;
  puVar5 = puVar1;
  if (hexadecimal == 0) {
    if (ui64 >> 0x20 == 0) {
      do {
        uVar6 = (uint)ui64;
        uVar2 = ui64 & 0xffffffff;
        ui64 = uVar2 / 10;
        puVar5[-1] = (byte)(uVar2 % 10) | 0x30;
        puVar5 = puVar5 + -1;
      } while (9 < uVar6);
    }
    else {
      do {
        puVar5[-1] = (byte)(ui64 % 10) | 0x30;
        puVar5 = puVar5 + -1;
        bVar8 = 9 < ui64;
        ui64 = ui64 / 10;
      } while (bVar8);
    }
  }
  else if (hexadecimal == 1) {
    do {
      puVar5[-1] = "0123456789abcdef"[(uint)ui64 & 0xf];
      puVar5 = puVar5 + -1;
      bVar8 = 0xf < ui64;
      ui64 = ui64 >> 4;
    } while (bVar8);
  }
  else {
    do {
      puVar5[-1] = "0123456789ABCDEF"[(uint)ui64 & 0xf];
      puVar5 = puVar5 + -1;
      bVar8 = 0xf < ui64;
      ui64 = ui64 >> 4;
    } while (bVar8);
  }
  puVar7 = buf + (long)register0x00000020 + (-0x24 - (long)puVar5);
  lVar3 = -(long)buf;
  lVar4 = 0;
  for (; (puVar1 + (lVar4 - (long)puVar5) < width && (buf < last)); buf = buf + 1) {
    *buf = zero;
    puVar7 = puVar7 + 1;
    lVar3 = lVar3 + -1;
    lVar4 = lVar4 + 1;
  }
  if (last < puVar7) {
    puVar7 = last;
  }
  memcpy(buf,puVar5,(size_t)(puVar7 + lVar3));
  return puVar7 + lVar3 + (long)buf;
}

Assistant:

static u_char *
ngx_sprintf_num(u_char *buf, u_char *last, uint64_t ui64, u_char zero,
    ngx_uint_t hexadecimal, ngx_uint_t width)
{
    u_char         *p, temp[NGX_INT64_LEN + 1];
                       /*
                        * we need temp[NGX_INT64_LEN] only,
                        * but icc issues the warning
                        */
    size_t          len;
    uint32_t        ui32;
    static u_char   hex[] = "0123456789abcdef";
    static u_char   HEX[] = "0123456789ABCDEF";

    p = temp + NGX_INT64_LEN;

    if (hexadecimal == 0) {

        if (ui64 <= (uint64_t) NGX_MAX_UINT32_VALUE) {

            /*
             * To divide 64-bit numbers and to find remainders
             * on the x86 platform gcc and icc call the libc functions
             * [u]divdi3() and [u]moddi3(), they call another function
             * in its turn.  On FreeBSD it is the qdivrem() function,
             * its source code is about 170 lines of the code.
             * The glibc counterpart is about 150 lines of the code.
             *
             * For 32-bit numbers and some divisors gcc and icc use
             * a inlined multiplication and shifts.  For example,
             * unsigned "i32 / 10" is compiled to
             *
             *     (i32 * 0xCCCCCCCD) >> 35
             */

            ui32 = (uint32_t) ui64;

            do {
                *--p = (u_char) (ui32 % 10 + '0');
            } while (ui32 /= 10);

        } else {
            do {
                *--p = (u_char) (ui64 % 10 + '0');
            } while (ui64 /= 10);
        }

    } else if (hexadecimal == 1) {

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = hex[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);

    } else { /* hexadecimal == 2 */

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = HEX[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);
    }

    /* zero or space padding */

    len = (temp + NGX_INT64_LEN) - p;

    while (len++ < width && buf < last) {
        *buf++ = zero;
    }

    /* number safe copy */

    len = (temp + NGX_INT64_LEN) - p;

    if (buf + len > last) {
        len = last - buf;
    }

    return ngx_cpymem(buf, p, len);
}